

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixMBD.h
# Opt level: O0

void __thiscall
chrono::ChFpMatrix34<double>::ChFpMatrix34(ChFpMatrix34<double> *this,ChQuaternion<double> *q)

{
  double dVar1;
  double *pdVar2;
  Scalar *pSVar3;
  ChQuaternion<double> *q_local;
  ChFpMatrix34<double> *this_local;
  
  Eigen::Matrix<double,_3,_4,_1,_3,_4>::Matrix(&this->super_ChMatrix34<double>);
  pdVar2 = ChQuaternion<double>::e1(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,0,0);
  *pSVar3 = dVar1;
  pdVar2 = ChQuaternion<double>::e0(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,0,1);
  *pSVar3 = dVar1;
  pdVar2 = ChQuaternion<double>::e3(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,0,2);
  *pSVar3 = -dVar1;
  pdVar2 = ChQuaternion<double>::e2(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,0,3);
  *pSVar3 = dVar1;
  pdVar2 = ChQuaternion<double>::e2(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,1,0);
  *pSVar3 = dVar1;
  pdVar2 = ChQuaternion<double>::e3(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,1,1);
  *pSVar3 = dVar1;
  pdVar2 = ChQuaternion<double>::e0(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,1,2);
  *pSVar3 = dVar1;
  pdVar2 = ChQuaternion<double>::e1(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,1,3);
  *pSVar3 = -dVar1;
  pdVar2 = ChQuaternion<double>::e3(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,2,0);
  *pSVar3 = dVar1;
  pdVar2 = ChQuaternion<double>::e2(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,2,1);
  *pSVar3 = -dVar1;
  pdVar2 = ChQuaternion<double>::e1(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,2,2);
  *pSVar3 = dVar1;
  pdVar2 = ChQuaternion<double>::e0(q);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)this,2,3);
  *pSVar3 = dVar1;
  return;
}

Assistant:

ChFpMatrix34(const ChQuaternion<Real>& q) {
        (*this)(0, 0) = q.e1();
        (*this)(0, 1) = q.e0();
        (*this)(0, 2) = -q.e3();
        (*this)(0, 3) = q.e2();
        (*this)(1, 0) = q.e2();
        (*this)(1, 1) = q.e3();
        (*this)(1, 2) = q.e0();
        (*this)(1, 3) = -q.e1();
        (*this)(2, 0) = q.e3();
        (*this)(2, 1) = -q.e2();
        (*this)(2, 2) = q.e1();
        (*this)(2, 3) = q.e0();
    }